

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_conversions.hpp
# Opt level: O3

Boxed_Value __thiscall
chaiscript::detail::
Type_Conversion_Impl<std::function<chaiscript::Boxed_Value_(const_chaiscript::Boxed_Value_&)>_>::
convert_down(Type_Conversion_Impl<std::function<chaiscript::Boxed_Value_(const_chaiscript::Boxed_Value_&)>_>
             *this,Boxed_Value *param_1)

{
  undefined8 *puVar1;
  
  puVar1 = (undefined8 *)__cxa_allocate_exception(0x38);
  puVar1[1] = &Type_Info::Unknown_Type::typeinfo;
  puVar1[2] = &Type_Info::Unknown_Type::typeinfo;
  *(undefined4 *)(puVar1 + 3) = 0x20;
  puVar1[4] = 0;
  puVar1[5] = 0x14;
  puVar1[6] = "No conversion exists";
  *puVar1 = &PTR__bad_cast_003d0bd8;
  __cxa_throw(puVar1,&chaiscript::exception::bad_boxed_type_cast::typeinfo,std::bad_cast::~bad_cast)
  ;
}

Assistant:

Boxed_Value convert_down(const Boxed_Value &) const override {
        throw chaiscript::exception::bad_boxed_type_cast("No conversion exists");
      }